

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O2

void __thiscall Coverage_sha1_Test::TestBody(Coverage_sha1_Test *this)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  AnalyserModelPtr analyserModel;
  GeneratorPtr generator;
  string xs;
  AnalyserPtr analyser;
  GeneratorProfilePtr generatorProfile;
  ModelPtr model;
  ParserPtr parser;
  string local_40 [32];
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"generator/algebraic_eqn_const_var_on_rhs/model.cellml",
             (allocator<char> *)&analyserModel);
  fileContents((string *)&xs);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&xs);
  std::__cxx11::string::~string((string *)&analyser);
  analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  analyserModel.super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&xs,"size_t(0)","parser->issueCount()",(unsigned_long *)&analyser,
             (unsigned_long *)&analyserModel);
  if ((char)xs._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&analyser);
    if (xs._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)xs._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&analyserModel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&analyserModel,(Message *)&analyser);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&analyserModel);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&analyser);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&xs._M_string_length);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel
            ((shared_ptr *)
             analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  analyserModel.super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&xs,"size_t(0)","analyser->errorCount()",(unsigned_long *)&analyserModel,
             (unsigned_long *)&generator);
  if ((char)xs._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&analyserModel);
    if (xs._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)xs._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&generator,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0x111,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&generator,(Message *)&analyserModel)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&generator);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&analyserModel);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&xs._M_string_length);
  libcellml::Analyser::model();
  libcellml::Generator::create();
  libcellml::GeneratorProfile::create((Profile)&generatorProfile);
  libcellml::Generator::setModel
            ((shared_ptr *)
             generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Generator::setProfile
            ((shared_ptr *)
             generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  xs._M_dataplus._M_p = (pointer)&xs.field_2;
  xs._M_string_length = 0;
  xs.field_2._M_local_buf[0] = '\0';
  iVar1 = 0x40;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    std::__cxx11::string::append((char *)&xs);
    libcellml::GeneratorProfile::setVoiString
              ((string *)
               generatorProfile.
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    libcellml::Generator::implementationCode_abi_cxx11_();
    std::__cxx11::string::~string(local_40);
  }
  std::__cxx11::string::~string((string *)&xs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&generatorProfile.
              super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyserModel.super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Coverage, sha1)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/algebraic_eqn_const_var_on_rhs/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();
    auto generatorProfile = libcellml::GeneratorProfile::create();

    generator->setModel(analyserModel);
    generator->setProfile(generatorProfile);

    std::string xs = {};

    for (int i = 0; i < 64; ++i) {
        xs += "x";
        // Note: the x's eventually ensure 100% coverage in our SHA-1 utility.

        generatorProfile->setVoiString(xs);

        generator->implementationCode();
    }
}